

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O2

s32 __thiscall
irr::core::array<irr::CIrrDeviceSDL::SKeyMap>::binary_search
          (array<irr::CIrrDeviceSDL::SKeyMap> *this,SKeyMap *element,s32 left,s32 right)

{
  pointer pSVar1;
  __normal_iterator<const_irr::CIrrDeviceSDL::SKeyMap_*,_std::vector<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>_>
  _Var2;
  s32 sVar3;
  
  sVar3 = -1;
  if (left <= right) {
    pSVar1 = (this->m_data).
             super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var2 = ::std::
            __lower_bound<__gnu_cxx::__normal_iterator<irr::CIrrDeviceSDL::SKeyMap_const*,std::vector<irr::CIrrDeviceSDL::SKeyMap,std::allocator<irr::CIrrDeviceSDL::SKeyMap>>>,irr::CIrrDeviceSDL::SKeyMap,__gnu_cxx::__ops::_Iter_less_val>
                      (pSVar1 + left,pSVar1 + right,element);
    if (element->SDLKey == (_Var2._M_current)->SDLKey) {
      sVar3 = (s32)((ulong)((long)_Var2._M_current -
                           (long)(this->m_data).
                                 super__Vector_base<irr::CIrrDeviceSDL::SKeyMap,_std::allocator<irr::CIrrDeviceSDL::SKeyMap>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    }
  }
  return sVar3;
}

Assistant:

s32 binary_search(const T &element, s32 left, s32 right) const
	{
		if (left > right)
			return -1;
		auto lpos = std::next(m_data.begin(), left);
		auto rpos = std::next(m_data.begin(), right);
		auto it = std::lower_bound(lpos, rpos, element);
		// *it = first element in [first, last) that is >= element, or last if not found.
		if (*it < element || element < *it)
			return -1;
		return static_cast<u32>(it - m_data.begin());
	}